

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void movsw_(PDISASM pMyDisasm)

{
  char *pcVar1;
  Int64 *pIVar2;
  int iVar3;
  Int32 IVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  UInt8 UVar11;
  
  if ((pMyDisasm->Prefix).RepnePrefix == '\x02') {
    (pMyDisasm->Prefix).RepnePrefix = '\x01';
  }
  if ((pMyDisasm->Prefix).RepPrefix == '\x02') {
    (pMyDisasm->Prefix).RepPrefix = '\x01';
  }
  (pMyDisasm->Instruction).Category = 0x10007;
  iVar3 = (pMyDisasm->Reserved_).OperandSize;
  pcVar1 = (pMyDisasm->Instruction).Mnemonic;
  if (iVar3 == 0x20) {
    builtin_strncpy(pcVar1,"movsd",6);
    IVar4 = 0x20;
  }
  else if (iVar3 == 0x40) {
    builtin_strncpy(pcVar1,"movsq",6);
    IVar4 = 0x40;
  }
  else {
    builtin_strncpy(pcVar1,"movsw",6);
    IVar4 = 0x10;
  }
  (pMyDisasm->Operand1).OpType = 0x30000;
  (pMyDisasm->Operand1).Memory.BaseRegister = 0x80;
  (pMyDisasm->Operand1).OpSize = IVar4;
  (pMyDisasm->Operand2).OpType = 0x30000;
  (pMyDisasm->Operand2).Memory.BaseRegister = 0x40;
  (pMyDisasm->Operand2).OpSize = IVar4;
  (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 0xc0;
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
  (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 0x21;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar5 = EFLAGS_TABLE[0x44].SF_;
  UVar6 = EFLAGS_TABLE[0x44].ZF_;
  UVar7 = EFLAGS_TABLE[0x44].AF_;
  UVar8 = EFLAGS_TABLE[0x44].PF_;
  UVar9 = EFLAGS_TABLE[0x44].CF_;
  UVar10 = EFLAGS_TABLE[0x44].TF_;
  UVar11 = EFLAGS_TABLE[0x44].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x44].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar5;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar6;
  (pMyDisasm->Instruction).Flags.AF_ = UVar7;
  (pMyDisasm->Instruction).Flags.PF_ = UVar8;
  (pMyDisasm->Instruction).Flags.CF_ = UVar9;
  (pMyDisasm->Instruction).Flags.TF_ = UVar10;
  (pMyDisasm->Instruction).Flags.IF_ = UVar11;
  UVar5 = EFLAGS_TABLE[0x44].NT_;
  UVar6 = EFLAGS_TABLE[0x44].RF_;
  UVar7 = EFLAGS_TABLE[0x44].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x44].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar5;
  (pMyDisasm->Instruction).Flags.RF_ = UVar6;
  (pMyDisasm->Instruction).Flags.alignment = UVar7;
  return;
}

Assistant:

void __bea_callspec__ movsw_(PDISASM pMyDisasm)
{
    if (pMyDisasm->Prefix.RepnePrefix == SuperfluousPrefix) {
        pMyDisasm->Prefix.RepnePrefix = InUsePrefix;
    }
    if (pMyDisasm->Prefix.RepPrefix == SuperfluousPrefix) {
        pMyDisasm->Prefix.RepPrefix = InUsePrefix;
    }
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+STRING_INSTRUCTION;
    if (GV.OperandSize == 64) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movsq");
        #endif
        pMyDisasm->Operand1.OpType = MEMORY_TYPE;
        pMyDisasm->Operand1.Memory.BaseRegister = REG7;
        pMyDisasm->Operand1.OpSize = 64;
        pMyDisasm->Operand2.OpType = MEMORY_TYPE;
        pMyDisasm->Operand2.Memory.BaseRegister = REG6;
        pMyDisasm->Operand2.OpSize = 64;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG6+REG7;
        GV.EIP_++;
        FillFlags(pMyDisasm, 68);
    }
    else if (GV.OperandSize == 32) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movsd");
        #endif
        pMyDisasm->Operand1.OpType = MEMORY_TYPE;
        pMyDisasm->Operand1.Memory.BaseRegister = REG7;
        pMyDisasm->Operand1.OpSize = 32;
        pMyDisasm->Operand2.OpType = MEMORY_TYPE;
        pMyDisasm->Operand2.Memory.BaseRegister = REG6;
        pMyDisasm->Operand2.OpSize = 32;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG6+REG7;
        GV.EIP_++;
        FillFlags(pMyDisasm, 68);
    }
    else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movsw");
        #endif
        pMyDisasm->Operand1.OpType = MEMORY_TYPE;
        pMyDisasm->Operand1.Memory.BaseRegister = REG7;
        pMyDisasm->Operand1.OpSize = 16;
        pMyDisasm->Operand2.OpType = MEMORY_TYPE;
        pMyDisasm->Operand2.Memory.BaseRegister = REG6;
        pMyDisasm->Operand2.OpSize = 16;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG6+REG7;
        GV.EIP_++;
        FillFlags(pMyDisasm, 68);
    }
}